

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Scatter_acc_flat64(int g_a,void *v,int64_t *subsArray,int64_t n,void *alpha)

{
  Integer IVar1;
  void *__ptr;
  long in_RCX;
  long in_RDX;
  Integer *_subs_array;
  Integer ndim;
  Integer nv;
  Integer a;
  int i;
  int idx;
  Integer in_stack_000001a0;
  void *in_stack_000001c8;
  Integer in_stack_000001d0;
  Integer in_stack_000001d8;
  void *in_stack_000001e0;
  void *in_stack_000001e8;
  Integer in_stack_000001f0;
  int in_stack_ffffffffffffffac;
  undefined4 local_30;
  undefined4 local_2c;
  
  IVar1 = pnga_ndim(in_stack_000001a0);
  __ptr = malloc((int)IVar1 * in_RCX * 8);
  if (__ptr == (void *)0x0) {
    GA_Error((char *)0x0,in_stack_ffffffffffffffac);
  }
  for (local_2c = 0; local_2c < in_RCX; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < IVar1; local_30 = local_30 + 1) {
      *(long *)((long)__ptr + (local_2c * IVar1 + (IVar1 - local_30) + -1) * 8) =
           *(long *)(in_RDX + (local_2c * IVar1 + (long)local_30) * 8) + 1;
    }
  }
  pnga_scatter_acc(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
                   in_stack_000001d0,in_stack_000001c8);
  free(__ptr);
  return;
}

Assistant:

void NGA_Scatter_acc_flat64(int g_a, void *v, int64_t subsArray[], int64_t n, void *alpha)
{
    int idx, i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);

    /* adjust the indices for fortran interface */
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx*ndim+i] + 1;
    
    wnga_scatter_acc(a, v, _subs_array, 0, nv, alpha);
    
    free(_subs_array);
}